

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

uint TA_STOCH_FramePPLB(TA_ParamHolderPriv *params)

{
  uint uVar1;
  TA_MAType in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  
  uVar1 = TA_STOCH_Lookback(in_stack_00000010,in_stack_0000000c,in_stack_00000008,params._4_4_,
                            (TA_MAType)params);
  return uVar1;
}

Assistant:

unsigned int TA_STOCH_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_STOCH_Lookback(params->optIn[0].data.optInInteger, /* optInFastK_Period*/
/* Generated */                       params->optIn[1].data.optInInteger, /* optInSlowK_Period*/
/* Generated */                       (TA_MAType)params->optIn[2].data.optInInteger, /* optInSlowK_MAType*/
/* Generated */                       params->optIn[3].data.optInInteger, /* optInSlowD_Period*/
/* Generated */                       (TA_MAType)params->optIn[4].data.optInInteger /* optInSlowD_MAType*/ );
/* Generated */ }